

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void rftbsub(int n,double *a,int nc,double *c)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  uint uVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  uVar4 = n >> 1;
  if (2 < (int)uVar4) {
    lVar1 = (long)((nc * 2) / (int)uVar4);
    pdVar3 = c + lVar1;
    pdVar2 = c + (nc - lVar1);
    pdVar5 = a + (long)n + -1;
    uVar6 = 2;
    do {
      dVar7 = a[uVar6] - pdVar5[-1];
      dVar8 = *pdVar5 + a[uVar6 + 1];
      dVar9 = (0.5 - *pdVar2) * dVar7 + *pdVar3 * dVar8;
      dVar7 = dVar8 * (0.5 - *pdVar2) - dVar7 * *pdVar3;
      a[uVar6] = a[uVar6] - dVar9;
      a[uVar6 + 1] = a[uVar6 + 1] - dVar7;
      pdVar5[-1] = dVar9 + pdVar5[-1];
      *pdVar5 = *pdVar5 - dVar7;
      uVar6 = uVar6 + 2;
      pdVar3 = pdVar3 + lVar1;
      pdVar2 = pdVar2 + -lVar1;
      pdVar5 = pdVar5 + -2;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void rftbsub(int n, double *a, int nc, double *c) {
  int j, k, kk, ks, m;
  double wkr, wki, xr, xi, yr, yi;

  m = n >> 1;
  ks = 2 * nc / m;
  kk = 0;
  for (j = 2; j < m; j += 2) {
    k = n - j;
    kk += ks;
    wkr = 0.5 - c[nc - kk];
    wki = c[kk];
    xr = a[j] - a[k];
    xi = a[j + 1] + a[k + 1];
    yr = wkr * xr + wki * xi;
    yi = wkr * xi - wki * xr;
    a[j] -= yr;
    a[j + 1] -= yi;
    a[k] += yr;
    a[k + 1] -= yi;
  }
}